

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

int cd_product_type_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  char *name;
  coda_product_type *pcVar2;
  int iVar3;
  
  name = get_mandatory_attribute_value(attr,"name",info->node->tag);
  iVar3 = -1;
  if (name != (char *)0x0) {
    info->node->free_data = coda_product_type_delete;
    pcVar2 = coda_product_type_new(name);
    pnVar1 = info->node;
    pnVar1->data = pcVar2;
    if (pcVar2 != (coda_product_type *)0x0) {
      pnVar1->init_sub_element[0xb] = string_data_init;
      pnVar1->add_element_to_parent[0xb] = cd_product_type_set_description;
      pnVar1 = info->node;
      pnVar1->init_sub_element[0x1f] = cd_product_definition_init;
      pnVar1->add_element_to_parent[0x1f] = cd_product_type_add_product_definition;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int cd_product_type_init(parser_info *info, const char **attr)
{
    const char *name;

    name = get_mandatory_attribute_value(attr, "name", info->node->tag);
    if (name == NULL)
    {
        return -1;
    }
    info->node->free_data = (free_data_handler)coda_product_type_delete;
    info->node->data = coda_product_type_new(name);
    if (info->node->data == NULL)
    {
        return -1;
    }

    register_sub_element(info->node, element_cd_description, string_data_init, cd_product_type_set_description);
    register_sub_element(info->node, element_cd_product_definition, cd_product_definition_init,
                         cd_product_type_add_product_definition);

    return 0;
}